

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O1

int http1_on_body_chunk(http1_parser_s *parser,char *data,size_t data_len)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  FIOBJ FVar5;
  
  lVar1 = (parser->state).content_length;
  lVar2 = *(long *)(*(long *)&parser[-1].state.reserved + 0x40);
  if ((lVar2 < lVar1) || (lVar3 = (parser->state).read, lVar2 < lVar3)) {
    http_send_error((http_s *)(parser + 1),0x19d);
    iVar4 = -1;
  }
  else {
    if (lVar3 == 0) {
      if (lVar1 - 1U < 0x2000) {
        FVar5 = fiobj_data_newstr();
      }
      else {
        FVar5 = fiobj_data_newtmpfile();
      }
      *(FIOBJ *)&parser[3].state.reserved = FVar5;
    }
    fiobj_data_write(*(FIOBJ *)&parser[3].state.reserved,data,data_len);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int http1_on_body_chunk(http1_parser_s *parser, char *data,
                               size_t data_len) {
  if (parser->state.content_length >
          (ssize_t)parser2http(parser)->p.settings->max_body_size ||
      parser->state.read >
          (ssize_t)parser2http(parser)->p.settings->max_body_size) {
    http_send_error(&http1_pr2handle(parser2http(parser)), 413);
    return -1; /* test every time, in case of chunked data */
  }
  if (!parser->state.read) {
    if (parser->state.content_length > 0 &&
        parser->state.content_length <= HTTP_MAX_HEADER_LENGTH) {
      http1_pr2handle(parser2http(parser)).body = fiobj_data_newstr();
    } else {
      http1_pr2handle(parser2http(parser)).body = fiobj_data_newtmpfile();
    }
  }
  fiobj_data_write(http1_pr2handle(parser2http(parser)).body, data, data_len);
  return 0;
}